

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O2

jas_image_fmtinfo_t * jas_image_lookupfmtbyname(char *name)

{
  int iVar1;
  int iVar2;
  jas_image_fmtinfo_t *pjVar3;
  int iVar4;
  
  iVar1 = jas_image_numfmts;
  pjVar3 = jas_image_fmtinfos;
  iVar4 = 0;
  while( true ) {
    if (iVar1 <= iVar4) {
      return (jas_image_fmtinfo_t *)0x0;
    }
    iVar2 = strcmp(pjVar3->name,name);
    if (iVar2 == 0) break;
    iVar4 = iVar4 + 1;
    pjVar3 = pjVar3 + 1;
  }
  return pjVar3;
}

Assistant:

const jas_image_fmtinfo_t *jas_image_lookupfmtbyname(const char *name)
{
	int i;
	const jas_image_fmtinfo_t *fmtinfo;

	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i, ++fmtinfo) {
		if (!strcmp(fmtinfo->name, name)) {
			return fmtinfo;
		}
	}
	return 0;
}